

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TreeNodeBehavior(ImGuiID id,ImGuiTreeNodeFlags flags,char *label,char *label_end)

{
  ImU32 *pIVar1;
  ImGuiItemStatusFlags *pIVar2;
  ImGuiWindow *pIVar3;
  ImVec2 pos;
  ImVec2 pos_00;
  ImVec2 pos_01;
  ImVec2 pos_02;
  ImVec2 pos_03;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  ImU32 IVar8;
  ImGuiWindowTempData *pIVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  bool hovered;
  bool held;
  ImVec2 text_pos;
  ImRect frame_bb;
  char log_suffix [3];
  ImVec2 label_size;
  char log_prefix [4];
  ImRect interact_bb;
  bool local_e6;
  bool local_e5;
  float local_e4;
  ImVec2 local_e0;
  ImRect local_d8;
  char local_bc [4];
  ImVec2 local_b8;
  char *local_b0;
  char *local_a8;
  char local_9c [4];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  ImRect local_68;
  ImVec2 local_50;
  undefined1 local_48 [16];
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  if (pIVar3->SkipItems == false) {
    if ((flags & 0x402U) == 0) {
      fVar14 = (pIVar3->DC).CurrLineTextBaseOffset;
      fVar13 = (pIVar4->Style).FramePadding.y;
      if (fVar13 <= fVar14) {
        fVar14 = fVar13;
      }
    }
    else {
      fVar14 = (pIVar4->Style).FramePadding.y;
    }
    local_88 = ZEXT416((uint)fVar14);
    local_78 = ZEXT416((uint)(pIVar4->Style).FramePadding.x);
    if (label_end == (char *)0x0) {
      label_end = FindRenderedTextEnd(label,(char *)0x0);
    }
    local_b0 = label_end;
    local_b8 = CalcTextSize(label,label_end,false,-1.0);
    pIVar9 = (ImGuiWindowTempData *)&pIVar3->WorkRect;
    if (((uint)flags >> 0xc & 1) == 0) {
      pIVar9 = &pIVar3->DC;
    }
    fVar14 = (pIVar3->DC).CurrLineSize.y;
    fVar13 = (pIVar4->Style).FramePadding.y;
    fVar13 = fVar13 + fVar13 + pIVar4->FontSize;
    if (fVar13 <= fVar14) {
      fVar14 = fVar13;
    }
    fVar13 = (float)local_88._0_4_ + (float)local_88._0_4_ + local_b8.y;
    uVar12 = -(uint)(fVar13 <= fVar14);
    local_68.Min.y = (float)(~uVar12 & (uint)fVar13 | (uint)fVar14 & uVar12);
    local_d8.Min.x = (pIVar9->CursorPos).x;
    local_d8.Min.y = (pIVar3->DC).CursorPos.y;
    local_d8.Max.x = (pIVar3->WorkRect).Max.x;
    if ((flags & 2U) == 0) {
      fVar14 = 2.0;
    }
    else {
      fVar14 = (pIVar3->WindowPadding).x * 0.5;
      local_d8.Min.x = local_d8.Min.x - (float)(int)(fVar14 + -1.0);
      local_d8.Max.x = local_d8.Max.x + (float)(int)fVar14;
      fVar14 = 3.0;
    }
    local_d8.Max.y = local_68.Min.y + local_d8.Min.y;
    local_e0.x = fVar14 * (float)local_78._0_4_ + pIVar4->FontSize;
    fVar14 = (pIVar3->DC).CurrLineTextBaseOffset;
    uVar12 = -(uint)(fVar14 <= (float)local_88._0_4_);
    local_e4 = (float)local_78._0_4_ + (float)local_78._0_4_;
    local_68.Min.x =
         (float)(-(uint)(0.0 < local_b8.x) & (uint)(local_e4 + local_b8.x)) + pIVar4->FontSize;
    local_98 = ZEXT416((uint)local_e0.x);
    local_e0.x = (pIVar3->DC).CursorPos.x + local_e0.x;
    local_e0.y = local_d8.Min.y + (float)(~uVar12 & (uint)fVar14 | uVar12 & local_88._0_4_);
    local_48 = ZEXT416((uint)local_68.Min.x);
    local_a8 = label;
    ItemSize(&local_68.Min,(float)local_88._0_4_);
    local_68.Min = local_d8.Min;
    local_68.Max = local_d8.Max;
    if ((flags & 0x1802U) == 0) {
      fVar14 = (pIVar4->Style).ItemSpacing.x;
      local_68.Max.y = local_d8.Max.y;
      local_68.Max.x = fVar14 + fVar14 + (float)local_48._0_4_ + local_d8.Min.x;
    }
    bVar5 = TreeNodeBehaviorIsOpen(id,flags);
    if (((bVar5) && ((flags & 0x2008U) == 0x2000)) && (pIVar4->NavIdIsAlive == false)) {
      pIVar1 = &(pIVar3->DC).TreeJumpToParentOnPopMask;
      *pIVar1 = *pIVar1 | 1 << ((byte)(pIVar3->DC).TreeDepth & 0x1f);
    }
    bVar6 = ItemAdd(&local_68,id,(ImRect *)0x0);
    pIVar2 = &(pIVar3->DC).LastItemStatusFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 2;
    (pIVar3->DC).LastItemDisplayRect.Min = local_d8.Min;
    (pIVar3->DC).LastItemDisplayRect.Max = local_d8.Max;
    if (bVar6) {
      uVar12 = 4;
      if ((flags & 0x40U) != 0) {
        uVar12 = (uint)flags >> 5 & 4 | 0x20;
      }
      uVar11 = uVar12 + 0x40;
      if (((uint)flags >> 8 & 1) != 0) {
        uVar11 = uVar12;
      }
      uVar11 = uVar11 + (flags & 4U) * 0x40;
      fVar14 = (pIVar4->Style).TouchExtraPadding.x;
      fVar13 = (local_e0.x - (float)local_98._0_4_) - fVar14;
      local_e4 = local_e4 + pIVar4->FontSize + (local_e0.x - (float)local_98._0_4_) + fVar14;
      local_88._0_4_ = fVar13;
      if (((pIVar3 != pIVar4->HoveredWindow) || (fVar14 = (pIVar4->IO).MousePos.x, fVar14 < fVar13))
         || (local_e4 <= fVar14)) {
        uVar11 = uVar11 | 0x1000;
      }
      bVar6 = ButtonBehavior(&local_68,id,&local_e6,&local_e5,uVar11);
      if (((uint)flags >> 8 & 1) == 0) {
        if (bVar6) {
          if (((flags & 0xc0U) == 0) || (pIVar4->NavActivateId == id)) {
            bVar7 = 1;
          }
          else {
            bVar7 = 0;
          }
          if ((char)flags < '\0') {
            fVar14 = (pIVar4->IO).MousePos.x;
            bVar10 = 0;
            if (((float)local_88._0_4_ <= fVar14) && (bVar10 = 0, fVar14 < local_e4)) {
              bVar10 = pIVar4->NavDisableMouseHover ^ 1;
            }
            bVar7 = bVar7 | bVar10;
          }
          bVar10 = bVar7;
          if (((flags & 0x40U) != 0) && (bVar10 = 1, (pIVar4->IO).MouseDoubleClicked[0] == false)) {
            bVar10 = bVar7;
          }
          bVar7 = 0;
          if (pIVar4->DragDropActive == false) {
            bVar7 = bVar10;
          }
          if (!bVar5) {
            bVar7 = bVar10;
          }
        }
        else {
          bVar7 = 0;
        }
        if (((pIVar4->NavId == id) && (pIVar4->NavMoveRequest == true)) &&
           (bVar5 && pIVar4->NavMoveDir == 0)) {
          NavMoveRequestCancel();
          bVar7 = 1;
        }
        if (((pIVar4->NavId == id) && (pIVar4->NavMoveRequest == true)) &&
           (pIVar4->NavMoveDir == 1 && !bVar5)) {
          NavMoveRequestCancel();
          bVar7 = 1;
        }
        if (bVar7 != 0) {
          bVar5 = !bVar5;
          ImGuiStorage::SetInt((pIVar3->DC).StateStorage,id,(uint)bVar5);
          pIVar2 = &(pIVar3->DC).LastItemStatusFlags;
          *(byte *)pIVar2 = (byte)*pIVar2 | 0x10;
        }
      }
      if ((flags & 4U) != 0) {
        SetItemAllowOverlap();
      }
      fVar14 = (float)GetColorU32(0,1.0);
      if ((flags & 2U) == 0) {
        if (((flags & 1U) == 0 & (local_e6 ^ 1U)) == 0) {
          uVar12 = 0x1a;
          if ((local_e5 & local_e6) == 0) {
            uVar12 = local_e6 | 0x18;
          }
          local_e4 = fVar14;
          IVar8 = GetColorU32(uVar12,1.0);
          RenderFrame(local_d8.Min,local_d8.Max,IVar8,false,0.0);
          RenderNavHighlight(&local_d8,id,2);
          fVar14 = local_e4;
        }
        if (((uint)flags >> 9 & 1) == 0) {
          if (((uint)flags >> 8 & 1) == 0) {
            pos_02.y = pIVar4->FontSize * 0.15 + local_e0.y;
            pos_02.x = (float)local_78._0_4_ + (local_e0.x - (float)local_98._0_4_);
            RenderArrow(pIVar3->DrawList,pos_02,(ImU32)fVar14,(uint)bVar5 * 2 + 1,0.7);
          }
        }
        else {
          pos_01.y = pIVar4->FontSize * 0.5 + local_e0.y;
          pos_01.x = local_e0.x - (float)local_98._0_4_ * 0.5;
          RenderBullet(pIVar3->DrawList,pos_01,(ImU32)fVar14);
        }
        if (pIVar4->LogEnabled == true) {
          LogRenderedText(&local_e0,">",(char *)0x0);
        }
        pos_03.y = local_e0.y;
        pos_03.x = local_e0.x;
        RenderText(pos_03,local_a8,local_b0,false);
      }
      else {
        if ((local_e5 != true) || (uVar12 = 0x1a, local_e6 == false)) {
          uVar12 = local_e6 | 0x18;
        }
        local_e4 = fVar14;
        IVar8 = GetColorU32(uVar12,1.0);
        RenderFrame(local_d8.Min,local_d8.Max,IVar8,true,(pIVar4->Style).FrameRounding);
        RenderNavHighlight(&local_d8,id,2);
        if (((uint)flags >> 9 & 1) == 0) {
          if (((uint)flags >> 8 & 1) == 0) {
            pos_00.y = local_e0.y;
            pos_00.x = (float)local_78._0_4_ + (local_e0.x - (float)local_98._0_4_);
            RenderArrow(pIVar3->DrawList,pos_00,(ImU32)local_e4,bVar5 + 1 + (uint)bVar5,1.0);
          }
          else {
            local_e0.x = local_e0.x - (float)local_98._0_4_;
          }
        }
        else {
          pos.y = pIVar4->FontSize * 0.5 + local_e0.y;
          pos.x = (float)local_98._0_4_ * -0.6 + local_e0.x;
          RenderBullet(pIVar3->DrawList,pos,(ImU32)local_e4);
        }
        if (((uint)flags >> 0x14 & 1) != 0) {
          local_d8.Max.x = local_d8.Max.x - (pIVar4->FontSize + (pIVar4->Style).FramePadding.x);
        }
        if (pIVar4->LogEnabled == true) {
          builtin_strncpy(local_9c,"\n##",4);
          local_bc[2] = 0;
          local_bc[0] = '#';
          local_bc[1] = '#';
          LogRenderedText(&local_e0,local_9c,local_9c + 3);
          local_50.x = 0.0;
          local_50.y = 0.0;
          RenderTextClipped(&local_e0,&local_d8.Max,local_a8,local_b0,&local_b8,&local_50,
                            (ImRect *)0x0);
          LogRenderedText(&local_e0,local_bc,local_bc + 2);
        }
        else {
          local_50.x = 0.0;
          local_50.y = 0.0;
          RenderTextClipped(&local_e0,&local_d8.Max,local_a8,local_b0,&local_b8,&local_50,
                            (ImRect *)0x0);
        }
      }
    }
    if (bVar5 == true && (char)((flags & 8U) >> 3) == '\0') {
      TreePushOverrideID(id);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}